

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall gss::innards::Proof::create_objective(Proof *this,int n,optional<int> d)

{
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var1;
  ostream *poVar2;
  mapped_type *pmVar3;
  long lVar4;
  int v;
  ulong uVar5;
  ulong uVar6;
  int v_2;
  ulong local_40;
  _Optional_payload_base<int> local_38;
  
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  uVar6 = (ulong)(uint)(~(n >> 0x1f) & n);
  if (((ulong)d.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
       >> 0x20 & 1) == 0) {
    std::operator<<((ostream *)&(_Var1._M_head_impl)->field_0x1d8,"min:");
    for (uVar5 = 0;
        poVar2 = (ostream *)
                 &((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  field_0x1d8, uVar6 != uVar5; uVar5 = uVar5 + 1) {
      poVar2 = std::operator<<(poVar2," 1 ~x");
      local_40 = uVar5;
      pmVar3 = std::
               map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->binary_variable_mappings,(key_type_conflict *)&local_40);
      std::operator<<(poVar2,(string *)pmVar3);
    }
    std::operator<<(poVar2," ;\n");
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      poVar2 = std::operator<<((ostream *)
                               &((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->field_0x558," 1 ~x");
      local_40 = uVar5;
      pmVar3 = std::
               map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->binary_variable_mappings,(key_type_conflict *)&local_40);
      std::operator<<(poVar2,(string *)pmVar3);
    }
  }
  else {
    local_38 = (_Optional_payload_base<int>)
               d.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>;
    std::operator<<((ostream *)&(_Var1._M_head_impl)->field_0x50,"* objective\n");
    for (uVar5 = 0;
        poVar2 = (ostream *)
                 &((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  field_0x50, uVar6 != uVar5; uVar5 = uVar5 + 1) {
      poVar2 = std::operator<<(poVar2,"1 x");
      local_40 = uVar5;
      pmVar3 = std::
               map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->binary_variable_mappings,(key_type_conflict *)&local_40);
      poVar2 = std::operator<<(poVar2,(string *)pmVar3);
      std::operator<<(poVar2," ");
    }
    poVar2 = std::operator<<(poVar2,">= ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_38._M_payload._M_value);
    std::operator<<(poVar2,";\n");
    _Var1._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    lVar4 = (_Var1._M_head_impl)->nb_constraints + 1;
    (_Var1._M_head_impl)->nb_constraints = lVar4;
    (_Var1._M_head_impl)->objective_line = lVar4;
  }
  return;
}

Assistant:

auto Proof::create_objective(int n, optional<int> d) -> void
{
    if (d) {
        _imp->model_stream << "* objective\n";
        for (int v = 0; v < n; ++v)
            _imp->model_stream << "1 x" << _imp->binary_variable_mappings[v] << " ";
        _imp->model_stream << ">= " << *d << ";\n";
        _imp->objective_line = ++_imp->nb_constraints;
    }
    else {
        _imp->model_prelude_stream << "min:";
        for (int v = 0; v < n; ++v)
            _imp->model_prelude_stream << " 1 ~x" << _imp->binary_variable_mappings[v];
        _imp->model_prelude_stream << " ;\n";

        for (int v = 0; v < n; ++v)
            _imp->objective_sum << " 1 ~x" << _imp->binary_variable_mappings[v];
    }
}